

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall Generator::generatePluginMetaData(Generator *this)

{
  long lVar1;
  QByteArrayView bv;
  QByteArrayView bv_00;
  bool bVar2;
  char *pcVar3;
  storage_type *psVar4;
  char *pcVar5;
  char *pcVar6;
  long in_RDI;
  long in_FS_OFFSET;
  qsizetype pos;
  anon_class_8_1_8991fb9c outputCborData;
  char (*in_stack_ffffffffffffff58) [3];
  FILE *pFVar7;
  QByteArrayView *in_stack_ffffffffffffff60;
  QByteArray *in_stack_ffffffffffffff68;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff78;
  qsizetype in_stack_ffffffffffffff80;
  storage_type *in_stack_ffffffffffffff88;
  long local_58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QByteArray::isEmpty((QByteArray *)0x11195b);
  if (!bVar2) {
    QByteArrayView::QByteArrayView<3ul>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    bv.m_data = in_stack_ffffffffffffff88;
    bv.m_size = in_stack_ffffffffffffff80;
    local_58 = QByteArray::indexOf(in_stack_ffffffffffffff68,bv,(qsizetype)in_stack_ffffffffffffff60
                                  );
    while (local_58 != -1) {
      pFVar7 = *(FILE **)(in_RDI + 8);
      QByteArray::left((QByteArray *)in_stack_ffffffffffffff60,(qsizetype)in_stack_ffffffffffffff78)
      ;
      pcVar3 = QByteArray::constData((QByteArray *)0x111a07);
      fprintf(pFVar7,"using namespace %s;\n",pcVar3);
      QByteArray::~QByteArray((QByteArray *)0x111a2a);
      psVar4 = (storage_type *)(*(long *)(in_RDI + 0x10) + 0x18);
      QByteArrayView::QByteArrayView<3ul>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      bv_00.m_data = psVar4;
      bv_00.m_size = in_stack_ffffffffffffff80;
      local_58 = QByteArray::indexOf(in_stack_ffffffffffffff68,bv_00,
                                     (qsizetype)in_stack_ffffffffffffff60);
    }
    fputs("\n#ifdef QT_MOC_EXPORT_PLUGIN_V2",*(FILE **)(in_RDI + 8));
    pFVar7 = *(FILE **)(in_RDI + 8);
    pcVar3 = QByteArray::constData((QByteArray *)0x111aa0);
    fprintf(pFVar7,"\nstatic constexpr unsigned char qt_pluginMetaDataV2_%s[] = {",pcVar3);
    generatePluginMetaData::anon_class_8_1_8991fb9c::operator()(in_stack_ffffffffffffff78);
    pFVar7 = *(FILE **)(in_RDI + 8);
    pcVar3 = QByteArray::constData((QByteArray *)0x111ade);
    pcVar5 = QByteArray::constData((QByteArray *)0x111af4);
    pcVar6 = QByteArray::constData((QByteArray *)0x111b0a);
    fprintf(pFVar7,"\n};\nQT_MOC_EXPORT_PLUGIN_V2(%s, %s, qt_pluginMetaDataV2_%s)\n",pcVar3,pcVar5,
            pcVar6);
    pFVar7 = *(FILE **)(in_RDI + 8);
    pcVar3 = QByteArray::constData((QByteArray *)0x111b41);
    fprintf(pFVar7,
            "#else\nQT_PLUGIN_METADATA_SECTION\nQ_CONSTINIT static constexpr unsigned char qt_pluginMetaData_%s[] = {\n    \'Q\', \'T\', \'M\', \'E\', \'T\', \'A\', \'D\', \'A\', \'T\', \'A\', \' \', \'!\',\n    // metadata version, Qt version, architectural requirements\n    0, QT_VERSION_MAJOR, QT_VERSION_MINOR, qPluginArchRequirements(),"
            ,pcVar3);
    generatePluginMetaData::anon_class_8_1_8991fb9c::operator()(in_stack_ffffffffffffff78);
    pFVar7 = *(FILE **)(in_RDI + 8);
    pcVar3 = QByteArray::constData((QByteArray *)0x111b7f);
    pcVar5 = QByteArray::constData((QByteArray *)0x111b95);
    fprintf(pFVar7,"\n};\nQT_MOC_EXPORT_PLUGIN(%s, %s)\n#endif  // QT_MOC_EXPORT_PLUGIN_V2\n",pcVar3
            ,pcVar5);
    fputs("\n",*(FILE **)(in_RDI + 8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Generator::generatePluginMetaData()
{
    if (cdef->pluginData.iid.isEmpty())
        return;

    auto outputCborData = [this]() {
        CborDevice dev(out);
        CborEncoder enc;
        cbor_encoder_init_writer(&enc, CborDevice::callback, &dev);

        CborEncoder map;
        cbor_encoder_create_map(&enc, &map, CborIndefiniteLength);

        dev.nextItem("\"IID\"");
        cbor_encode_int(&map, int(QtPluginMetaDataKeys::IID));
        cbor_encode_text_string(&map, cdef->pluginData.iid.constData(), cdef->pluginData.iid.size());

        dev.nextItem("\"className\"");
        cbor_encode_int(&map, int(QtPluginMetaDataKeys::ClassName));
        cbor_encode_text_string(&map, cdef->classname.constData(), cdef->classname.size());

        QJsonObject o = cdef->pluginData.metaData.object();
        if (!o.isEmpty()) {
            dev.nextItem("\"MetaData\"");
            cbor_encode_int(&map, int(QtPluginMetaDataKeys::MetaData));
            jsonObjectToCbor(&map, o);
        }

        if (!cdef->pluginData.uri.isEmpty()) {
            dev.nextItem("\"URI\"");
            cbor_encode_int(&map, int(QtPluginMetaDataKeys::URI));
            cbor_encode_text_string(&map, cdef->pluginData.uri.constData(), cdef->pluginData.uri.size());
        }

        // Add -M args from the command line:
        for (auto it = cdef->pluginData.metaArgs.cbegin(), end = cdef->pluginData.metaArgs.cend(); it != end; ++it) {
            const QJsonArray &a = it.value();
            QByteArray key = it.key().toUtf8();
            dev.nextItem(QByteArray("command-line \"" + key + "\"").constData());
            cbor_encode_text_string(&map, key.constData(), key.size());
            jsonArrayToCbor(&map, a);
        }

        // Close the CBOR map manually
        dev.nextItem();
        cbor_encoder_close_container(&enc, &map);
    };

    // 'Use' all namespaces.
    qsizetype pos = cdef->qualified.indexOf("::");
    for ( ; pos != -1 ; pos = cdef->qualified.indexOf("::", pos + 2) )
        fprintf(out, "using namespace %s;\n", cdef->qualified.left(pos).constData());

    fputs("\n#ifdef QT_MOC_EXPORT_PLUGIN_V2", out);

    // Qt 6.3+ output
    fprintf(out, "\nstatic constexpr unsigned char qt_pluginMetaDataV2_%s[] = {",
          cdef->classname.constData());
    outputCborData();
    fprintf(out, "\n};\nQT_MOC_EXPORT_PLUGIN_V2(%s, %s, qt_pluginMetaDataV2_%s)\n",
            cdef->qualified.constData(), cdef->classname.constData(), cdef->classname.constData());

    // compatibility with Qt 6.0-6.2
    fprintf(out, "#else\nQT_PLUGIN_METADATA_SECTION\n"
          "Q_CONSTINIT static constexpr unsigned char qt_pluginMetaData_%s[] = {\n"
          "    'Q', 'T', 'M', 'E', 'T', 'A', 'D', 'A', 'T', 'A', ' ', '!',\n"
          "    // metadata version, Qt version, architectural requirements\n"
          "    0, QT_VERSION_MAJOR, QT_VERSION_MINOR, qPluginArchRequirements(),",
          cdef->classname.constData());
    outputCborData();
    fprintf(out, "\n};\nQT_MOC_EXPORT_PLUGIN(%s, %s)\n"
                 "#endif  // QT_MOC_EXPORT_PLUGIN_V2\n",
            cdef->qualified.constData(), cdef->classname.constData());

    fputs("\n", out);
}